

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O1

optional<ConfigKey> * __thiscall
ConfigKey::parse(optional<ConfigKey> *__return_storage_ptr__,ConfigKey *this,string_view value)

{
  ConfigKey *__n;
  pointer pcVar1;
  uint64_t uVar2;
  int iVar3;
  size_type __rlen;
  ConfigKey *opt;
  pointer pCVar4;
  bool bVar5;
  bool bVar6;
  vector<ConfigKey,_std::allocator<ConfigKey>_> local_48;
  
  available();
  bVar5 = local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar5) {
    pCVar4 = local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      __n = (ConfigKey *)(pCVar4->key_)._M_string_length;
      if (__n == this) {
        if (__n == (ConfigKey *)0x0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp((pCVar4->key_)._M_dataplus._M_p,(void *)value._M_len,(size_t)__n);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.key_._M_dataplus =
             (pointer)((long)&(__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>
                              )._M_payload.super__Optional_payload<ConfigKey,_true,_false,_false>.
                              super__Optional_payload_base<ConfigKey>._M_payload + 0x10);
        pcVar1 = (pCVar4->key_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,
                   pcVar1 + (long)&(__n->key_)._M_dataplus._M_p);
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.max_ = pCVar4->max_;
        uVar2 = pCVar4->min_;
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.defval_ = pCVar4->defval_;
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_payload._M_value.min_ = uVar2;
        (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
        super__Optional_payload<ConfigKey,_true,_false,_false>.
        super__Optional_payload_base<ConfigKey>._M_engaged = true;
        if (bVar6) {
          std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_48);
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          goto LAB_00155ea7;
        }
      }
      pCVar4 = pCVar4 + 1;
      bVar5 = pCVar4 == local_48.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    } while (!bVar5);
  }
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_48);
LAB_00155ea7:
  (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
  super__Optional_payload<ConfigKey,_true,_false,_false>.super__Optional_payload_base<ConfigKey>.
  _M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<ConfigKey> ConfigKey::parse(std::string_view value) {
    for (const auto &opt : ConfigKey::available()) {
        if (opt.key() == value) {
            return opt;
        }
    }
    return std::nullopt;
}